

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O0

void ModulusHelper<int,char,0>::
     ModulusThrow<safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>>
               (int *t,char *u,int *result)

{
  bool bVar1;
  int *in_RDX;
  char *in_RSI;
  int *in_RDI;
  
  if (*in_RSI == '\0') {
    safeint_exception_handlers::SafeIntExceptionHandler<SafeIntException>::SafeIntOnDivZero();
  }
  bVar1 = mod_corner_case<char,_true>::is_undefined(*in_RSI);
  if (bVar1) {
    *in_RDX = 0;
  }
  else {
    *in_RDX = *in_RDI % (int)*in_RSI;
  }
  return;
}

Assistant:

SAFEINT_CONSTEXPR14 static void ModulusThrow( const T& t, const U& u, T& result ) SAFEINT_CPP_THROW
    {
        if(u == 0)
            E::SafeIntOnDivZero();

        //trap corner case
        if (mod_corner_case<U, std::numeric_limits< U >::is_signed >::is_undefined(u))
        {
            result = 0;
            return;
        }

        result = (T)(t % u);
    }